

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter>::
AdapterPromiseNode<kj::TimerImpl&,kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>
          (AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter> *this,
          TimerImpl *params,
          Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *params_1)

{
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined ***)this = &PTR_destroy_006e2c48;
  *(undefined ***)(this + 0x18) = &PTR_reject_006e2c98;
  this[0x20] = (AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter>)0x0;
  this[0x1b8] = (AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter>)0x0;
  this[0x1c0] = (AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter>)0x1;
  TimerImpl::TimerPromiseAdapter::TimerPromiseAdapter
            ((TimerPromiseAdapter *)(this + 0x1c8),(PromiseFulfiller<void> *)(this + 0x18),params,
             (TimePoint)(params_1->value).value);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}